

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tankmixmodel.cpp
# Opt level: O1

double __thiscall
TankMixModel::findFIFOQuality(TankMixModel *this,double vNet,double vIn,double wIn,SegPool *segPool)

{
  double dVar1;
  Segment *pSVar2;
  SystemError *this_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (0.0 < vIn) {
    pSVar2 = this->lastSeg;
    if ((pSVar2 == (Segment *)0x0) || (this->cTol <= ABS(pSVar2->c - wIn / vIn))) {
      pSVar2 = SegPool::getSegment(segPool,vIn,wIn / vIn);
      if (pSVar2 == (Segment *)0x0) {
        this_00 = (SystemError *)__cxa_allocate_exception(0x30);
        SystemError::SystemError(this_00,0);
        __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
      }
      if (this->firstSeg == (Segment *)0x0) {
        this->firstSeg = pSVar2;
      }
      if (this->lastSeg != (Segment *)0x0) {
        this->lastSeg->next = pSVar2;
      }
      this->lastSeg = pSVar2;
    }
    else {
      pSVar2->v = pSVar2->v + vIn;
    }
  }
  dVar4 = vIn - vNet;
  dVar3 = 0.0;
  dVar6 = 0.0;
  do {
    if (dVar4 <= 0.0) break;
    pSVar2 = this->firstSeg;
    if (pSVar2 != (Segment *)0x0) {
      dVar1 = pSVar2->v;
      dVar5 = dVar4;
      if ((pSVar2 != this->lastSeg) && (dVar1 <= dVar4)) {
        dVar5 = dVar1;
      }
      dVar6 = dVar6 + dVar5;
      dVar3 = pSVar2->c * dVar5 + dVar3;
      dVar4 = dVar4 - dVar5;
      if (((dVar4 < 0.0) || (dVar5 < dVar1)) || (pSVar2->next == (Segment *)0x0)) {
        pSVar2->v = dVar1 - dVar5;
      }
      else {
        this->firstSeg = pSVar2->next;
        SegPool::freeSegment(segPool,pSVar2);
      }
    }
  } while (pSVar2 != (Segment *)0x0);
  dVar4 = 0.0;
  if (dVar6 <= 0.0) {
    if (this->firstSeg != (Segment *)0x0) {
      dVar4 = this->firstSeg->c;
    }
  }
  else {
    dVar4 = dVar3 / dVar6;
  }
  this->cTank = dVar4;
  return dVar4;
}

Assistant:

double TankMixModel::findFIFOQuality(double vNet, double vIn, double wIn,
                                     SegPool* segPool)
{
    // ... add new last segment for flow entering the tank
    if ( vIn > 0.0 )
    {
        // ... increase segment volume if inflow has same quality as segment
        double cIn = wIn / vIn;
        if ( lastSeg && abs(lastSeg->c - cIn ) < cTol ) lastSeg->v += vIn;

        // ... otherwise add a new last segment to the tank
        else
        {
            Segment* seg = segPool->getSegment(vIn, cIn);
            if ( seg == nullptr ) throw SystemError(SystemError::OUT_OF_MEMORY);
            if ( firstSeg == nullptr ) firstSeg = seg;
            if ( lastSeg ) lastSeg->next = seg;
            lastSeg = seg;
        }
    }

    // ... withdraw flow from first segment
    double vSum = 0.0;
    double wSum = 0.0;
    double vOut = vIn - vNet;
    while (vOut > 0.0)
    {
        Segment* seg = firstSeg;
        if ( seg == nullptr ) break;
        double vSeg = min(seg->v, vOut);
        if ( seg == lastSeg ) vSeg = vOut;
        vSum += vSeg;
        wSum += seg->c * vSeg;
        vOut -= vSeg;
        if ( vOut >= 0.0 && vSeg >= seg->v && seg->next )
        {
            firstSeg = seg->next;
            segPool->freeSegment(seg);
        }
        else seg->v -= vSeg;
    }

    // ... return average quality withdrawn from 1st segment
    if ( vSum > 0.0 ) cTank = wSum / vSum;
    else if ( firstSeg == nullptr ) cTank = 0.0;
    else  cTank = firstSeg->c;
    return cTank;
}